

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_HashNumericVarArgExpr_Test::~ExprTest_HashNumericVarArgExpr_Test
          (ExprTest_HashNumericVarArgExpr_Test *this)

{
  void *in_RDI;
  
  ~ExprTest_HashNumericVarArgExpr_Test((ExprTest_HashNumericVarArgExpr_Test *)0x14b4e8);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, HashNumericVarArgExpr) {
  // Test computing hash for numeric expressions with abitrary numeric
  // arguments: VarArgExpr, SumExpr, NumberOfExpr.
  NumericExpr args[] = { MakeVariable(0), MakeVariable(1), MakeConst(42)};
  CheckHash(MakeIterated(expr::MIN, args));
  CheckHash(MakeIterated(expr::SUM, args));
  CheckHash(MakeIterated(expr::NUMBEROF, args));
}